

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O0

void __thiscall RunPool<int>::AddFront(RunPool<int> *this,int *value)

{
  RunBlock<int> *pRVar1;
  RunBlock<int> *temp;
  int *value_local;
  RunPool<int> *this_local;
  
  if (this->begin_front_ == (RunBlock<int> *)0x0) {
    pRVar1 = Alloc();
    this->begin_front_ = pRVar1;
    this->begin_front_->next_free_pos_ = 799;
    this->begin_front_->is_front = true;
    this->begin_front_->next = this->begin_back_;
    this->end_front_ = this->begin_front_;
    this->begin_back_->prev = this->end_front_;
  }
  if (this->begin_front_->next_free_pos_ < 0) {
    pRVar1 = Alloc();
    pRVar1->is_front = true;
    pRVar1->next = this->begin_front_;
    pRVar1->values[799] = *value;
    pRVar1->next_free_pos_ = 0x31e;
    this->begin_front_->prev = pRVar1;
    this->begin_front_ = pRVar1;
    this->size_ = this->size_ + 800;
  }
  else {
    this->begin_front_->values[this->begin_front_->next_free_pos_] = *value;
    this->begin_front_->next_free_pos_ = this->begin_front_->next_free_pos_ + -1;
  }
  return;
}

Assistant:

void AddFront(ValueType &value) {
        if(begin_front_ == NULL) {
            begin_front_ = Alloc();
            begin_front_->next_free_pos_ = kValuesPerBlock - 1;
            begin_front_->is_front = true;
            begin_front_->next = begin_back_;

            end_front_ = begin_front_;
            begin_back_->prev = end_front_;
        }

        if(begin_front_->next_free_pos_ < 0) {
            RunBlock<ValueType>* temp = Alloc();
            temp->is_front = true;
            temp->next = begin_front_;
            temp->values[kValuesPerBlock - 1] = value;
            temp->next_free_pos_ = kValuesPerBlock - 2;

            begin_front_->prev = temp;
            begin_front_ = temp;
            size_ += kValuesPerBlock;

        } else {
            begin_front_->values[begin_front_->next_free_pos_] = value;
            begin_front_->next_free_pos_--;
        }
    }